

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<float>::Read
          (TPZDohrSubstructCondense<float> *this,TPZStream *input,void *context)

{
  TPZDohrSubstructCondense<float> *pTVar1;
  TPZMatRed<float,_TPZFMatrix<float>_> *pTVar2;
  ostream *poVar3;
  mapped_type *vec;
  int ic;
  int iVar4;
  int control;
  ENumbering local_5c;
  int b;
  int a_1;
  int nc;
  int four;
  TPZDohrSubstructCondense<float> *local_48;
  int three;
  int two;
  int one;
  int a;
  
  (*input->_vptr_TPZStream[0x1d])(input,&a,1);
  if (a != 0) {
    pTVar2 = (TPZMatRed<float,_TPZFMatrix<float>_> *)operator_new(800);
    TPZMatRed<float,_TPZFMatrix<float>_>::TPZMatRed(pTVar2);
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator=(&this->fMatRedComplete,pTVar2);
    pTVar2 = ((this->fMatRedComplete).fRef)->fPointer;
    (*(pTVar2->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[6])
              (pTVar2,input,0);
  }
  (*input->_vptr_TPZStream[0x1d])(input,&this->fNEquations,1);
  (*input->_vptr_TPZStream[0x1d])(input,&this->fNumInternalEquations,1);
  (*input->_vptr_TPZStream[0x1d])(input,&this->fNumExternalEquations,1);
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,this->fNEquations);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->fNumInternalEquations);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->fNumExternalEquations);
  std::endl<char,std::char_traits<char>>(poVar3);
  TPZStream::Read<int>(input,&this->fCoarseNodes);
  poVar3 = ::operator<<((ostream *)&std::cout,&this->fCoarseNodes);
  std::endl<char,std::char_traits<char>>(poVar3);
  one = -1;
  two = -2;
  three = -3;
  four = -4;
  (*input->_vptr_TPZStream[0x1d])(input,&one,1);
  TPZFMatrix<float>::Read(&this->fPhiC,input,(void *)0x0);
  (*input->_vptr_TPZStream[0x1d])(input,&two,1);
  TPZFMatrix<float>::Read(&this->fPhiC_Weighted_Condensed,input,(void *)0x0);
  (*input->_vptr_TPZStream[0x1d])(input,&three,1);
  TPZStream::Read<float>(input,&(this->fWeights).super_TPZVec<float>);
  TPZFMatrix<float>::Read(&this->fKCi,input,(void *)0x0);
  (*input->_vptr_TPZStream[0x1d])(input,&four,1);
  (*input->_vptr_TPZStream[0x1d])(input,&nc,1);
  local_48 = this;
  for (iVar4 = 0; iVar4 < nc; iVar4 = iVar4 + 1) {
    (*input->_vptr_TPZStream[0x1d])(input,&a_1,1);
    (*input->_vptr_TPZStream[0x1d])(input,&b,1);
    control = a_1;
    local_5c = b;
    vec = std::
          map<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>,_std::less<std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>_>,_std::allocator<std::pair<const_std::pair<TPZDohrSubstructCondense<float>::ENumbering,_TPZDohrSubstructCondense<float>::ENumbering>,_TPZVec<int>_>_>_>
          ::operator[](&this->fPermutationsScatter,(key_type *)&control);
    TPZStream::Read<int>(input,vec);
  }
  (*input->_vptr_TPZStream[0x1d])(input,&control,1);
  pTVar1 = local_48;
  if (control != 0) {
    pTVar2 = (TPZMatRed<float,_TPZFMatrix<float>_> *)operator_new(800);
    TPZMatRed<float,_TPZFMatrix<float>_>::TPZMatRed(pTVar2);
    TPZAutoPointer<TPZMatRed<float,_TPZFMatrix<float>_>_>::operator=(&pTVar1->fMatRed,pTVar2);
    pTVar2 = ((pTVar1->fMatRed).fRef)->fPointer;
    (*(pTVar2->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[6])
              (pTVar2,input,0);
  }
  TPZFMatrix<float>::Read(&pTVar1->fLocalLoad,input,(void *)0x0);
  TPZFMatrix<float>::Read(&pTVar1->fLocalWeightedResidual,input,(void *)0x0);
  TPZFMatrix<float>::Read(&pTVar1->fAdjustSolution,input,(void *)0x0);
  return;
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Read(TPZStream &input, void *context)
{
    int a;
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&a);
    if (a) {
        fMatRedComplete = new TPZMatRed<TVar, TPZFMatrix<TVar> >;
        fMatRedComplete->Read(input,0);
    }
    
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNEquations);
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNumInternalEquations);
    SAVEABLE_SKIP_NOTE(input);
    input.Read(&fNumExternalEquations);
    std::cout << fNEquations << " " << fNumInternalEquations << " " << fNumExternalEquations << std::endl;
    input.Read( fCoarseNodes);
    std::cout << fCoarseNodes << std::endl;
    int one(-1),two(-2),three(-3),four(-4);

    input.Read(&one);
    fPhiC.Read(input, 0);
    input.Read(&two);
    fPhiC_Weighted_Condensed.Read(input, 0);
    input.Read(&three);
    input.Read( fWeights);
    fKCi.Read(input, 0);
    input.Read(&four);
    int nc;
    input.Read(&nc);
    for (int ic=0; ic<nc; ic++) {
        int a;
        int b;
        input.Read(&a);
        input.Read(&b);
        ENumbering orig = (ENumbering)(a),dest = (ENumbering)(b);
        std::pair<ENumbering, ENumbering> p(orig,dest);
        input.Read( fPermutationsScatter[p]);
    }
    int control;
    input.Read(&control);
    if(control)
    {
        fMatRed = new TPZMatRed<TVar, TPZFMatrix<TVar> >;
        fMatRed->Read(input, 0);
    }
    fLocalLoad.Read(input, 0);
    fLocalWeightedResidual.Read(input, 0);
    fAdjustSolution.Read(input, 0);
    
    
}